

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
::store_if_better(solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
                  *this,bit_array *x,double current,long i)

{
  long lVar1;
  
  if ((this->m_best).value < current) {
    bit_array_impl::operator=((bit_array_impl *)&this->m_best,&x->super_bit_array_impl);
    lVar1 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar1;
    (this->m_best).duration = (double)(lVar1 - (this->m_begin).__d.__r) / 1000000000.0;
    (this->m_best).loop = i;
    (this->m_best).remaining_constraints = 0;
    (this->m_best).value = current;
  }
  return;
}

Assistant:

inline bool
is_better_solution(Float lhs, Float rhs) noexcept
{
    if constexpr (std::is_same_v<Mode, minimize_tag>)
        return lhs < rhs;
    else
        return lhs > rhs;
}